

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O0

void __thiscall Fl_Scroll::Fl_Scroll(Fl_Scroll *this,int X,int Y,int W,int H,char *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Scroll *this_local;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Scroll_002ed340;
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(&this->scrollbar,(X + W) - iVar1,Y,iVar2,H - iVar3,(char *)0x0);
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(&this->hscrollbar,X,(Y + H) - iVar1,W - iVar2,iVar3,(char *)0x0);
  Fl_Widget::type((Fl_Widget *)this,'\x03');
  this->oldx = 0;
  this->xposition_ = 0;
  this->oldy = 0;
  this->yposition_ = 0;
  this->scrollbar_size_ = 0;
  Fl_Widget::type((Fl_Widget *)&this->hscrollbar,'\x01');
  Fl_Widget::callback((Fl_Widget *)&this->hscrollbar,hscrollbar_cb);
  Fl_Widget::callback((Fl_Widget *)&this->scrollbar,scrollbar_cb);
  return;
}

Assistant:

Fl_Scroll::Fl_Scroll(int X,int Y,int W,int H,const char* L)
  : Fl_Group(X,Y,W,H,L),
    scrollbar(X+W-Fl::scrollbar_size(),Y,
              Fl::scrollbar_size(),H-Fl::scrollbar_size()),
    hscrollbar(X,Y+H-Fl::scrollbar_size(),
               W-Fl::scrollbar_size(),Fl::scrollbar_size()) {
  type(BOTH);
  xposition_ = oldx = 0;
  yposition_ = oldy = 0;
  scrollbar_size_ = 0;
  hscrollbar.type(FL_HORIZONTAL);
  hscrollbar.callback(hscrollbar_cb);
  scrollbar.callback(scrollbar_cb);
}